

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O1

int __thiscall ncnn::Convolution::create_pipeline(Convolution *this,Option *opt)

{
  float fVar1;
  size_t sVar2;
  int *piVar3;
  void *pvVar4;
  long *plVar5;
  Allocator *pAVar6;
  iterator __position;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar7;
  int iVar8;
  Layer *pLVar9;
  bool bVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  Mat int8_weight_data;
  Mat weight_data_n;
  Mat int8_weight_data_n;
  Option opt_q;
  void *ptr;
  Mat local_a48;
  Option *local_a00;
  ModelBinFromMatArray local_9f8;
  undefined4 uStack_9e8;
  undefined4 uStack_9e4;
  int iStack_9e0;
  Allocator *local_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  long local_9c0;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_9b0;
  void *local_9a8;
  undefined4 uStack_9a0;
  undefined4 uStack_99c;
  undefined4 uStack_998;
  undefined4 uStack_994;
  int iStack_990;
  Allocator *local_988;
  undefined8 local_980;
  undefined8 uStack_978;
  long local_970;
  vector<float,std::allocator<float>> *local_960;
  undefined4 local_958;
  int iStack_954;
  Allocator *pAStack_950;
  undefined4 local_948;
  undefined4 uStack_944;
  undefined4 uStack_940;
  undefined4 uStack_93c;
  undefined8 local_938;
  ParamDict local_930;
  
  sVar2 = (this->weight_data).elemsize;
  if ((sVar2 == 1) && (opt->use_int8_inference == false)) {
    create_pipeline();
    return -1;
  }
  if (opt->use_int8_inference == true && sVar2 == 4) {
    bVar10 = this->int8_scale_term != 0;
  }
  else {
    bVar10 = (bool)(sVar2 == 1 & opt->use_int8_inference);
  }
  this->use_int8_inference = bVar10;
  if ((sVar2 == 4) && (bVar10 != false)) {
    local_a48.w = this->weight_data_size;
    local_a48.cstep = (size_t)local_a48.w;
    local_a48.data = (void *)0x0;
    local_a48.refcount._0_4_ = 0;
    local_a48.refcount._4_4_ = 0;
    local_a48.refcount = (int *)0x0;
    local_a48.elemsize._0_4_ = 1;
    local_a48.elemsize._4_4_ = 0;
    local_a48.elempack = 1;
    local_a48.allocator = (Allocator *)0x0;
    local_a48.dims = 1;
    local_a48.h = 1;
    local_a48.c = 1;
    local_a00 = opt;
    if (local_a48.w != 0) {
      uVar11 = local_a48.cstep + 3 & 0xfffffffffffffffc;
      local_930.params[0]._0_8_ = (void *)0x0;
      iVar8 = posix_memalign((void **)&local_930,0x10,uVar11 + 4);
      if (iVar8 != 0) {
        local_930.params[0]._0_8_ = (void *)0x0;
      }
      local_a48.data = (void *)local_930.params[0]._0_8_;
      local_a48.refcount = (int *)(local_930.params[0]._0_8_ + uVar11);
      *(undefined4 *)(local_930.params[0]._0_8_ + uVar11) = 1;
    }
    if (local_a48.data == (void *)0x0) {
      bVar10 = true;
    }
    else {
      bVar10 = (long)local_a48.c * local_a48.cstep == 0;
    }
    if (bVar10) {
      if (local_a48.refcount != (int *)0x0) {
        LOCK();
        *local_a48.refcount = *local_a48.refcount + -1;
        UNLOCK();
        if (*local_a48.refcount == 0) {
          if (local_a48.allocator == (Allocator *)0x0) {
            if (local_a48.data != (void *)0x0) {
              free(local_a48.data);
            }
          }
          else {
            (**(code **)(*(long *)local_a48.allocator + 0x18))();
          }
        }
      }
      return -100;
    }
    local_9b0 = (vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                ((ulong)local_9b0 & 0xffffffffffffff00);
    iVar8 = this->weight_data_size / this->num_output;
    if (0 < this->num_output) {
      lVar13 = (long)iVar8;
      lVar12 = 0;
      do {
        pLVar9 = create_layer(0x39);
        ParamDict::ParamDict(&local_930);
        ParamDict::set(&local_930,0,
                       *(float *)((long)(this->weight_data_int8_scales).data + lVar12 * 4));
        (*pLVar9->_vptr_Layer[2])(pLVar9,&local_930);
        (*pLVar9->_vptr_Layer[4])(pLVar9,local_a00);
        local_958 = *(undefined4 *)local_a00;
        iStack_954 = local_a00->num_threads;
        local_948 = *(undefined4 *)&local_a00->workspace_allocator;
        uStack_944 = *(undefined4 *)((long)&local_a00->workspace_allocator + 4);
        uStack_940._0_1_ = local_a00->use_winograd_convolution;
        uStack_940._1_1_ = local_a00->use_sgemm_convolution;
        uStack_940._2_1_ = local_a00->use_int8_inference;
        uStack_940._3_1_ = local_a00->use_vulkan_compute;
        uStack_93c._0_1_ = local_a00->use_fp16_packed;
        uStack_93c._1_1_ = local_a00->use_fp16_storage;
        uStack_93c._2_1_ = local_a00->use_fp16_arithmetic;
        uStack_93c._3_1_ = local_a00->use_int8_storage;
        local_938._0_1_ = local_a00->use_int8_arithmetic;
        local_938._1_1_ = local_a00->use_packing_layout;
        local_938._2_6_ = *(undefined6 *)&local_a00->field_0x22;
        pAStack_950 = local_a48.allocator;
        sVar2 = (this->weight_data).elemsize;
        local_9f8.super_ModelBin._vptr_ModelBin =
             (_func_int **)(sVar2 * lVar12 * lVar13 + (long)(this->weight_data).data);
        iStack_9e0 = (this->weight_data).elempack;
        local_9d8 = (this->weight_data).allocator;
        local_9f8.weights._0_4_ = 0;
        local_9f8.weights._4_4_ = 0;
        uStack_9e8 = (undefined4)sVar2;
        uStack_9e4 = (undefined4)(sVar2 >> 0x20);
        local_9d0 = CONCAT44(iVar8,1);
        uStack_9c8 = 0x100000001;
        local_9a8 = (void *)(lVar12 * lVar13 *
                             CONCAT44(local_a48.elemsize._4_4_,(undefined4)local_a48.elemsize) +
                            (long)local_a48.data);
        uStack_9a0 = 0;
        uStack_99c = 0;
        uStack_998 = (undefined4)local_a48.elemsize;
        uStack_994 = local_a48.elemsize._4_4_;
        iStack_990 = local_a48.elempack;
        local_988 = local_a48.allocator;
        local_980 = CONCAT44(iVar8,1);
        uStack_978 = 0x100000001;
        local_9c0 = lVar13;
        local_970 = lVar13;
        (*pLVar9->_vptr_Layer[7])(pLVar9,&local_9f8,&local_9a8,&local_958);
        (*pLVar9->_vptr_Layer[1])(pLVar9);
        piVar3 = (int *)CONCAT44(uStack_99c,uStack_9a0);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_988 == (Allocator *)0x0) {
              if (local_9a8 != (void *)0x0) {
                free(local_9a8);
              }
            }
            else {
              (**(code **)(*(long *)local_988 + 0x18))();
            }
          }
        }
        uStack_998 = 0;
        uStack_994 = 0;
        iStack_990 = 0;
        local_9a8 = (void *)0x0;
        uStack_9a0 = 0;
        uStack_99c = 0;
        local_980 = 0;
        uStack_978 = 0;
        local_970 = 0;
        piVar3 = (int *)CONCAT44(local_9f8.weights._4_4_,local_9f8.weights._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_9d8 == (Allocator *)0x0) {
              if (local_9f8.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                free(local_9f8.super_ModelBin._vptr_ModelBin);
              }
            }
            else {
              (**(code **)(*(long *)local_9d8 + 0x18))();
            }
          }
        }
        uStack_9e8 = 0;
        uStack_9e4 = 0;
        iStack_9e0 = 0;
        local_9f8.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
        local_9f8.weights._0_4_ = 0;
        local_9f8.weights._4_4_ = 0;
        local_9d0 = 0;
        uStack_9c8 = 0;
        local_9c0 = 0;
        lVar14 = 0x8c0;
        do {
          piVar3 = *(int **)((long)&local_930.params[0].v.data + lVar14);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = *(void **)((long)&local_930.params[0].type + lVar14);
              plVar5 = *(long **)((long)&local_930.params[0].v.elempack + lVar14);
              if (plVar5 == (long *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (**(code **)(*plVar5 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_930.params[0].v.data + lVar14 + 4) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar14 + 4) = 0;
          *(undefined8 *)((long)&local_930.params[0].type + lVar14) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.data + lVar14) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar14) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.dims + lVar14) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.h + lVar14) = 0;
          lVar14 = lVar14 + -0x48;
        } while (lVar14 != -0x40);
        lVar12 = lVar12 + 1;
      } while (lVar12 < this->num_output);
    }
    if (&this->weight_data != &local_a48) {
      if (local_a48.refcount != (int *)0x0) {
        LOCK();
        *local_a48.refcount = *local_a48.refcount + 1;
        UNLOCK();
      }
      piVar3 = (this->weight_data).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = (this->weight_data).data;
          pAVar6 = (this->weight_data).allocator;
          if (pAVar6 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (**(code **)(*(long *)pAVar6 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&(this->weight_data).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data).elemsize + 4) = 0;
      (this->weight_data).data = (void *)0x0;
      (this->weight_data).refcount = (int *)0x0;
      (this->weight_data).dims = 0;
      (this->weight_data).w = 0;
      (this->weight_data).h = 0;
      (this->weight_data).c = 0;
      (this->weight_data).cstep = 0;
      (this->weight_data).data = local_a48.data;
      (this->weight_data).refcount = local_a48.refcount;
      (this->weight_data).elemsize =
           CONCAT44(local_a48.elemsize._4_4_,(undefined4)local_a48.elemsize);
      (this->weight_data).elempack = local_a48.elempack;
      (this->weight_data).allocator = local_a48.allocator;
      (this->weight_data).dims = local_a48.dims;
      (this->weight_data).w = local_a48.w;
      (this->weight_data).h = local_a48.h;
      (this->weight_data).c = local_a48.c;
      (this->weight_data).cstep = local_a48.cstep;
    }
    opt = local_a00;
    if (local_a48.refcount != (int *)0x0) {
      LOCK();
      *local_a48.refcount = *local_a48.refcount + -1;
      UNLOCK();
      if (*local_a48.refcount == 0) {
        if (local_a48.allocator == (Allocator *)0x0) {
          if (local_a48.data != (void *)0x0) {
            free(local_a48.data);
          }
        }
        else {
          (**(code **)(*(long *)local_a48.allocator + 0x18))();
        }
      }
    }
    local_a48.elemsize._0_4_ = 0;
    local_a48.elemsize._4_4_ = 0;
    local_a48.elempack = 0;
    local_a48.data = (void *)0x0;
    local_a48.refcount._0_4_ = 0;
    local_a48.refcount._4_4_ = 0;
    local_a48.dims = 0;
    local_a48.w = 0;
    local_a48.h = 0;
    local_a48.c = 0;
    local_a48.cstep = 0;
    if ((char)local_9b0 != '\0') {
      return -100;
    }
  }
  if (this->use_int8_inference == true) {
    pLVar9 = create_layer(0x39);
    this->quantize = pLVar9;
    ParamDict::ParamDict(&local_930);
    ParamDict::set(&local_930,0,this->bottom_blob_int8_scale);
    (*this->quantize->_vptr_Layer[2])(this->quantize,&local_930);
    (*this->quantize->_vptr_Layer[4])(this->quantize,opt);
    lVar12 = 0x8c0;
    local_a00 = opt;
    do {
      piVar3 = *(int **)((long)&local_930.params[0].v.data + lVar12);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = *(void **)((long)&local_930.params[0].type + lVar12);
          plVar5 = *(long **)((long)&local_930.params[0].v.elempack + lVar12);
          if (plVar5 == (long *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (**(code **)(*plVar5 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar12 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar12 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].type + lVar12) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar12) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar12) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.dims + lVar12) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.h + lVar12) = 0;
      lVar12 = lVar12 + -0x48;
    } while (lVar12 != -0x40);
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
              (&this->dequantize_ops,(long)this->num_output);
    if (0 < this->num_output) {
      local_960 = (vector<float,std::allocator<float>> *)&this->dequantize_scales;
      lVar12 = 0;
      local_9b0 = &this->dequantize_ops;
      do {
        pvVar7 = local_9b0;
        pLVar9 = create_layer(0x3a);
        (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar12] = pLVar9;
        fVar1 = *(float *)((long)(this->weight_data_int8_scales).data + lVar12 * 4);
        local_9a8 = (void *)CONCAT44((int)((ulong)local_9a8 >> 0x20),
                                     ~-(uint)(fVar1 == 0.0) &
                                     (uint)(1.0 / (this->bottom_blob_int8_scale * fVar1)));
        ParamDict::ParamDict(&local_930);
        ParamDict::set(&local_930,0,local_9a8._0_4_);
        ParamDict::set(&local_930,1,this->bias_term);
        ParamDict::set(&local_930,2,1);
        pLVar9 = (pvVar7->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start[lVar12];
        (*pLVar9->_vptr_Layer[2])(pLVar9,&local_930);
        pLVar9 = (pvVar7->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start[lVar12];
        (*pLVar9->_vptr_Layer[4])(pLVar9,local_a00);
        sVar2 = (this->bias_data).elemsize;
        local_a48.data = (void *)(sVar2 * lVar12 + (long)(this->bias_data).data);
        local_a48.elempack = (this->bias_data).elempack;
        local_a48.allocator = (this->bias_data).allocator;
        uStack_9e8 = (undefined4)sVar2;
        uStack_9e4 = (undefined4)(sVar2 >> 0x20);
        local_a48.cstep = 1;
        local_a48.h = 1;
        local_a48.c = 1;
        local_a48.dims = 1;
        local_a48.w = 1;
        local_a48.elemsize._4_4_ = uStack_9e4;
        local_a48.elemsize._0_4_ = uStack_9e8;
        local_a48.refcount._4_4_ = 0;
        local_a48.refcount._0_4_ = 0;
        uStack_9e8 = 0;
        uStack_9e4 = 0;
        iStack_9e0 = 0;
        local_9f8.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
        local_9f8.weights._0_4_ = 0;
        local_9f8.weights._4_4_ = 0;
        local_9d0 = 0;
        uStack_9c8 = 0;
        local_9c0 = 0;
        pLVar9 = (pvVar7->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start[lVar12];
        local_9d8 = local_a48.allocator;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_9f8,&local_a48);
        (*pLVar9->_vptr_Layer[3])(pLVar9,&local_9f8);
        ModelBin::~ModelBin(&local_9f8.super_ModelBin);
        __position._M_current =
             (this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    (local_960,__position,(float *)&local_9a8);
        }
        else {
          *__position._M_current = local_9a8._0_4_;
          (this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        piVar3 = (int *)CONCAT44(local_a48.refcount._4_4_,local_a48.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_a48.allocator == (Allocator *)0x0) {
              if (local_a48.data != (void *)0x0) {
                free(local_a48.data);
              }
            }
            else {
              (**(code **)(*(long *)local_a48.allocator + 0x18))();
            }
          }
        }
        local_a48.elemsize._0_4_ = 0;
        local_a48.elemsize._4_4_ = 0;
        local_a48.elempack = 0;
        local_a48.data = (void *)0x0;
        local_a48.refcount._0_4_ = 0;
        local_a48.refcount._4_4_ = 0;
        local_a48.dims = 0;
        local_a48.w = 0;
        local_a48.h = 0;
        local_a48.c = 0;
        local_a48.cstep = 0;
        lVar13 = 0x8c0;
        do {
          piVar3 = *(int **)((long)&local_930.params[0].v.data + lVar13);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = *(void **)((long)&local_930.params[0].type + lVar13);
              plVar5 = *(long **)((long)&local_930.params[0].v.elempack + lVar13);
              if (plVar5 == (long *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (**(code **)(*plVar5 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_930.params[0].v.data + lVar13 + 4) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar13 + 4) = 0;
          *(undefined8 *)((long)&local_930.params[0].type + lVar13) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.data + lVar13) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar13) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.dims + lVar13) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.h + lVar13) = 0;
          lVar13 = lVar13 + -0x48;
        } while (lVar13 != -0x40);
        lVar12 = lVar12 + 1;
      } while (lVar12 < this->num_output);
    }
  }
  return 0;
}

Assistant:

int Convolution::create_pipeline(const Option& opt)
{
    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !opt.use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    use_int8_inference = opt.use_int8_inference && (weight_data_is_int8 || (weight_data_is_float32 && int8_scale_term));

    // runtime quantize the weight data
    if (weight_data_is_float32 && use_int8_inference)
    {
        // quantize weight to int8
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_output = weight_data_size / num_output;

        for (int n=0; n<num_output; n++)
        {
            Layer* op = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, weight_data_int8_scales[n]);// scale

            op->load_param(pd);

            op->create_pipeline(opt);

            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;

            const Mat weight_data_n = weight_data.range(weight_data_size_output * n, weight_data_size_output);
            Mat int8_weight_data_n = int8_weight_data.range(weight_data_size_output * n, weight_data_size_output);
            op->forward(weight_data_n, int8_weight_data_n, opt_q);

            delete op;
        }

        weight_data = int8_weight_data;
    }

    // initial the quantize,dequantize op layer
    if (use_int8_inference)
    {
        quantize = ncnn::create_layer(ncnn::LayerType::Quantize);
        {
            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scale);// scale

            quantize->load_param(pd);

            quantize->create_pipeline(opt);
        }

        dequantize_ops.resize(num_output);
        for (int n=0; n<num_output; n++)
        {
            dequantize_ops[n] = ncnn::create_layer(ncnn::LayerType::Dequantize);

            float top_rescale = 1.f;

            if (weight_data_int8_scales[n] == 0)
                top_rescale = 0;
            else
                top_rescale = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[n]);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);  // bias_term
            pd.set(2, 1);          // bias_data_size

            dequantize_ops[n]->load_param(pd);

            dequantize_ops[n]->create_pipeline(opt);

            ncnn::Mat weights[1];
            weights[0] = bias_data.range(n, 1);

            dequantize_ops[n]->load_model(ModelBinFromMatArray(weights));

            dequantize_scales.push_back(top_rescale);
        }
    }

    return 0;
}